

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int histo_minmax_expr_workfn
              (long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
              void *userPtr)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  int iVar4;
  long in_RCX;
  int in_R8D;
  long in_R9;
  long *in_stack_00000008;
  iteratorCol *outcol;
  ParseStatusVariables *pv;
  histo_minmax_workfn_struct *wf;
  double nulval;
  double *data;
  long i;
  int status;
  int in_stack_0000008c;
  long in_stack_00000090;
  long in_stack_00000098;
  long in_stack_000000a0;
  long in_stack_000000a8;
  void *in_stack_000000c0;
  long local_40;
  
  lVar2 = *in_stack_00000008;
  iVar4 = fits_parser_workfn(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090
                             ,in_stack_0000008c,(iteratorCol *)userPtr,in_stack_000000c0);
  pdVar3 = *(double **)(in_R9 + (long)(in_R8D + -1) * 0x110 + 0x60);
  dVar1 = **(double **)(*in_stack_00000008 + 0x10);
  for (local_40 = 1; local_40 <= in_RCX * *(long *)(lVar2 + 0x50); local_40 = local_40 + 1) {
    if ((((*pdVar3 == 0.0) && (!NAN(*pdVar3))) || (pdVar3[local_40] != dVar1)) ||
       (NAN(pdVar3[local_40]) || NAN(dVar1))) {
      if ((pdVar3[local_40] < (double)in_stack_00000008[1]) ||
         (((double)in_stack_00000008[1] == -9.1191291391491e-36 &&
          (!NAN((double)in_stack_00000008[1]))))) {
        in_stack_00000008[1] = (long)pdVar3[local_40];
      }
      if (((double)in_stack_00000008[2] <= pdVar3[local_40] &&
           pdVar3[local_40] != (double)in_stack_00000008[2]) ||
         (((double)in_stack_00000008[2] == -9.1191291391491e-36 &&
          (!NAN((double)in_stack_00000008[2]))))) {
        in_stack_00000008[2] = (long)pdVar3[local_40];
      }
      in_stack_00000008[4] = in_stack_00000008[4] + 1;
    }
    in_stack_00000008[3] = in_stack_00000008[3] + 1;
  }
  return iVar4;
}

Assistant:

static int histo_minmax_expr_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which evaluates a parser result and computes       */
/* min max value */
/*---------------------------------------------------------------------------*/
{
  int status = 0;
  long i;
  double *data;
  double nulval;
  struct histo_minmax_workfn_struct *wf = ((struct histo_minmax_workfn_struct *)userPtr);
  struct ParseStatusVariables *pv = &(wf->Info->parseVariables);
  iteratorCol *outcol = &(colData[nCols-1]);

  /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
  status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
			      nCols, colData, (void *) wf->Info);

  /* The result of the calculation is in pv->Data, and null value in pv->Null */
  data = (double *)(outcol->array);
  nulval = *((double *)(wf->Info->nullPtr));

  for (i = 1; i<=(nrows*pv->repeat); i++ ) {
    /* Note that data[0] == 0 indicates no null values at all!!! */
    if (data[0] == 0 || data[i] != nulval) {
      if (data[i] < wf->datamin || wf->datamin == DOUBLENULLVALUE) wf->datamin = data[i];
      if (data[i] > wf->datamax || wf->datamax == DOUBLENULLVALUE) wf->datamax = data[i];
      wf->ngood ++;
    }
     wf->ntotal ++;
  }

  return status;
}